

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O1

RABlock * __thiscall
asmjit::v1_14::BaseRAPass::newBlockOrExistingAt
          (BaseRAPass *this,LabelNode *cbLabel,BaseNode **stoppedAt)

{
  uint uVar1;
  Error EVar2;
  RABlock *pRVar3;
  undefined4 extraout_var;
  FuncNode *pFVar4;
  LabelNode *pLVar5;
  FuncNode *pFVar6;
  long lVar7;
  
  pRVar3 = *(RABlock **)(cbLabel + 0x20);
  if (pRVar3 == (RABlock *)0x0) {
    pFVar4 = *(FuncNode **)cbLabel;
    if (pFVar4 == (FuncNode *)0x0) {
      lVar7 = 0;
      pRVar3 = (RABlock *)0x0;
    }
    else {
      pFVar6 = this->_func;
      pRVar3 = (RABlock *)0x0;
      lVar7 = 0;
      do {
        if (pFVar4->field_0x10 != '\x04') {
          if (pFVar4->field_0x10 != '\x03') break;
          if (pFVar4 == pFVar6) {
            newBlockOrExistingAt();
            pRVar3 = (RABlock *)0x0;
            if (*(int *)&this->field_0xbc == *(int *)&this->field_0xb8) {
              EVar2 = ZoneVectorBase::_grow((ZoneVectorBase *)&this->_blocks,&this->_allocator,8,1);
              pRVar3 = (RABlock *)CONCAT44(extraout_var,EVar2);
            }
            if ((int)pRVar3 == 0) {
              uVar1 = *(uint *)&this->field_0xb8;
              *(uint *)&pFVar6->field_0x8 = uVar1;
              if (*(uint *)&this->field_0xbc <= uVar1) {
                addBlock();
                return (RABlock *)0x3;
              }
              *(FuncNode **)(*(long *)&this->_blocks + (ulong)uVar1 * 8) = pFVar6;
              *(int *)&this->field_0xb8 = *(int *)&this->field_0xb8 + 1;
              pRVar3 = (RABlock *)0x0;
            }
            return pRVar3;
          }
          if (*(RABlock **)&pFVar4->field_0x20 != (RABlock *)0x0) {
            pRVar3 = *(RABlock **)&pFVar4->field_0x20;
            if (pFVar4 == (FuncNode *)pFVar6->_exitNode) {
              pRVar3 = (RABlock *)0x0;
            }
            break;
          }
          lVar7 = lVar7 + 1;
        }
        pFVar4 = *(FuncNode **)pFVar4;
      } while (pFVar4 != (FuncNode *)0x0);
    }
    if (stoppedAt != (BaseNode **)0x0) {
      *stoppedAt = (BaseNode *)pFVar4;
    }
    if (pRVar3 == (RABlock *)0x0) goto LAB_00128874;
    while (*(RABlock **)(cbLabel + 0x20) = pRVar3, pLVar5 = cbLabel, lVar7 != 0) {
LAB_00128838:
      pLVar5 = *(LabelNode **)pLVar5;
      do {
        if (pLVar5[0x10] == (LabelNode)0x3) goto LAB_0012884b;
        pLVar5 = *(LabelNode **)pLVar5;
      } while (pLVar5 != (LabelNode *)0x0);
      newBlockOrExistingAt();
LAB_00128874:
      pRVar3 = newBlock(this,(BaseNode *)0x0);
      if (pRVar3 == (RABlock *)0x0) {
        return (RABlock *)0x0;
      }
    }
LAB_00128854:
    if (*(long *)(pRVar3 + 0x10) == 0) {
      *(LabelNode **)(pRVar3 + 0x10) = pLVar5;
      *(LabelNode **)(pRVar3 + 0x18) = cbLabel;
    }
  }
  return pRVar3;
LAB_0012884b:
  *(RABlock **)(pLVar5 + 0x20) = pRVar3;
  lVar7 = lVar7 + -1;
  if (lVar7 == 0) goto LAB_00128854;
  goto LAB_00128838;
}

Assistant:

RABlock* BaseRAPass::newBlockOrExistingAt(LabelNode* cbLabel, BaseNode** stoppedAt) noexcept {
  if (cbLabel->hasPassData())
    return cbLabel->passData<RABlock>();

  FuncNode* func = this->func();
  BaseNode* node = cbLabel->prev();
  RABlock* block = nullptr;

  // Try to find some label, but terminate the loop on any code. We try hard to coalesce code that contains two
  // consecutive labels or a combination of non-code nodes between 2 or more labels.
  //
  // Possible cases that would share the same basic block:
  //
  //   1. Two or more consecutive labels:
  //     Label1:
  //     Label2:
  //
  //   2. Two or more labels separated by non-code nodes:
  //     Label1:
  //     ; Some comment...
  //     .align 16
  //     Label2:
  size_t nPendingLabels = 0;

  while (node) {
    if (node->type() == NodeType::kLabel) {
      // Function has a different NodeType, just make sure this was not messed up as we must never associate
      // BasicBlock with a `func` itself.
      ASMJIT_ASSERT(node != func);

      block = node->passData<RABlock>();
      if (block) {
        // Exit node has always a block associated with it. If we went here it means that `cbLabel` passed here
        // is after the end of the function and cannot be merged with the function exit block.
        if (node == func->exitNode())
          block = nullptr;
        break;
      }

      nPendingLabels++;
    }
    else if (node->type() == NodeType::kAlign) {
      // Align node is fine.
    }
    else {
      break;
    }

    node = node->prev();
  }

  if (stoppedAt)
    *stoppedAt = node;

  if (!block) {
    block = newBlock();
    if (ASMJIT_UNLIKELY(!block))
      return nullptr;
  }

  cbLabel->setPassData<RABlock>(block);
  node = cbLabel;

  while (nPendingLabels) {
    node = node->prev();
    for (;;) {
      if (node->type() == NodeType::kLabel) {
        node->setPassData<RABlock>(block);
        nPendingLabels--;
        break;
      }

      node = node->prev();
      ASMJIT_ASSERT(node != nullptr);
    }
  }

  if (!block->first()) {
    block->setFirst(node);
    block->setLast(cbLabel);
  }

  return block;
}